

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::buildTargets((anonymous_namespace)::BuildContext&,std::vector<std::__cxx11::
string,std::allocator<std::__cxx11::string>>const&)::TargetsTask::inputsAvailable(llbuild::core::
TaskInterface_(void *this,TaskInterface ti)

{
  BuildValue *local_f8;
  CommandSignature local_f0;
  undefined1 local_e8 [80];
  BuildValue local_98;
  ValueType local_38;
  void *local_20;
  TargetsTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (TargetsTask *)ti.impl;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  local_e8._32_8_ = 0;
  local_e8._40_8_ = 0;
  local_e8[0x30] = '\0';
  local_f8 = (BuildValue *)(local_e8 + 0x31);
  local_20 = this;
  do {
    *(undefined1 *)&local_f8->kind = ExistingInput;
    local_f8 = (BuildValue *)((long)&local_f8->kind + 1);
  } while (local_f8 != &local_98);
  memset(&local_f0,0,8);
  llbuild::basic::CommandSignature::CommandSignature(&local_f0);
  anon_unknown.dwarf_83ee8::BuildValue::makeSuccessfulCommand
            (&local_98,(FileInfo *)local_e8,local_f0);
  anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_38,&local_98);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  anon_unknown.dwarf_83ee8::BuildValue::~BuildValue(&local_98);
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // Complete the job.
      ti.complete(
        BuildValue::makeSuccessfulCommand({}, CommandSignature()).toValue());
      return;
    }